

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

NULLCArray NULLC::IntToStr(int *r)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  char cVar9;
  NULLCArray NVar10;
  char buf [16];
  char local_28;
  char local_27 [15];
  
  if (r == (int *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    NVar10 = (NULLCArray)ZEXT812(0);
  }
  else {
    iVar2 = *r;
    cVar4 = (char)(iVar2 % 10);
    local_28 = -cVar4;
    if (0 < iVar2 % 10) {
      local_28 = cVar4;
    }
    local_28 = local_28 + '0';
    iVar5 = iVar2;
    pcVar6 = local_27;
    pcVar7 = &local_28;
    for (iVar8 = iVar2; pcVar1 = pcVar6, 0x12 < iVar8 + 9U; iVar8 = iVar8 - iVar3) {
      iVar3 = iVar5 >> 0x1f;
      iVar8 = iVar5 / 10 + iVar3;
      iVar5 = iVar8 - iVar3;
      cVar4 = (char)(iVar5 % 10);
      cVar9 = -cVar4;
      if (0 < iVar5 % 10) {
        cVar9 = cVar4;
      }
      *pcVar1 = cVar9 + '0';
      pcVar6 = pcVar1 + 1;
      pcVar7 = pcVar1;
    }
    pcVar6 = pcVar1;
    if (iVar2 < 0) {
      pcVar6 = pcVar7 + 2;
      *pcVar1 = '-';
    }
    NVar10 = AllocArray(1,((int)pcVar6 - (int)&local_28) + 1,2);
    pcVar7 = NVar10.ptr;
    do {
      pcVar1 = pcVar6 + -1;
      pcVar6 = pcVar6 + -1;
      *pcVar7 = *pcVar1;
      pcVar7 = pcVar7 + 1;
    } while (pcVar6 != &local_28);
  }
  return NVar10;
}

Assistant:

NULLCArray NULLC::IntToStr(int* r)
{
	NULLCArray arr = { 0, 0 };
	if(!r)
	{
		nullcThrowError("ERROR: null pointer access");
		return arr;
	}

	int number = *r;
	bool sign = 0;
	char buf[16];
	char *curr = buf;
	if(number < 0)
		sign = 1;

	*curr++ = (char)(abs(number % 10) + '0');
	while(number /= 10)
		*curr++ = (char)(abs(number % 10) + '0');
	if(sign)
		*curr++ = '-';
	arr = AllocArray(1, (int)(curr - buf) + 1, NULLC_TYPE_CHAR);
	char *str = arr.ptr;
	do 
	{
		--curr;
		*str++ = *curr;
	}while(curr != buf);
	return arr;
}